

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWDUtils.cpp
# Opt level: O1

string * GetRegisterName_abi_cxx11_(string *__return_storage_ptr__,SWDRegisters reg)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch(reg) {
  case SWDR_DP_IDCODE:
    pcVar2 = "IDCODE";
    pcVar1 = "";
    break;
  case SWDR_DP_ABORT:
    pcVar2 = "ABORT";
    pcVar1 = "";
    break;
  case SWDR_DP_CTRL_STAT:
    pcVar2 = "CTRL/STAT";
    pcVar1 = "";
    break;
  case SWDR_DP_WCR:
    pcVar2 = "WCR";
    pcVar1 = "";
    break;
  case SWDR_DP_RESEND:
    pcVar2 = "RESEND";
    pcVar1 = "";
    break;
  case SWDR_DP_SELECT:
    pcVar2 = "SELECT";
    pcVar1 = "";
    break;
  case SWDR_DP_RDBUFF:
    pcVar2 = "RDBUFF";
    pcVar1 = "";
    break;
  case SWDR_DP_ROUTESEL:
    pcVar2 = "ROUTESEL";
    pcVar1 = "";
    break;
  case SWDR_AP_CSW:
    pcVar2 = "CSW";
    pcVar1 = "";
    break;
  case SWDR_AP_TAR:
    pcVar2 = "TAR";
    pcVar1 = "";
    break;
  case SWDR_AP_DRW:
    pcVar2 = "DRW";
    pcVar1 = "";
    break;
  case SWDR_AP_BD0:
    pcVar2 = "BD0";
    pcVar1 = "";
    break;
  case SWDR_AP_BD1:
    pcVar2 = "BD1";
    pcVar1 = "";
    break;
  case SWDR_AP_BD2:
    pcVar2 = "BD2";
    pcVar1 = "";
    break;
  case SWDR_AP_BD3:
    pcVar2 = "BD3";
    pcVar1 = "";
    break;
  case SWDR_AP_CFG:
    pcVar2 = "CFG";
    pcVar1 = "";
    break;
  case SWDR_AP_BASE:
    pcVar2 = "BASE";
    pcVar1 = "";
    break;
  case SWDR_AP_RAZ_WI:
    pcVar2 = "RAZ_WI";
    pcVar1 = "";
    break;
  case SWDR_AP_IDR:
    pcVar2 = "IDR";
    pcVar1 = "";
    break;
  default:
    pcVar2 = "??";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string GetRegisterName( SWDRegisters reg )
{
    switch( reg )
    {
    case SWDR_DP_IDCODE:
        return "IDCODE";
    case SWDR_DP_ABORT:
        return "ABORT";
    case SWDR_DP_CTRL_STAT:
        return "CTRL/STAT";
    case SWDR_DP_WCR:
        return "WCR";
    case SWDR_DP_RESEND:
        return "RESEND";
    case SWDR_DP_SELECT:
        return "SELECT";
    case SWDR_DP_RDBUFF:
        return "RDBUFF";
    case SWDR_DP_ROUTESEL:
        return "ROUTESEL";

    case SWDR_AP_CSW:
        return "CSW";
    case SWDR_AP_TAR:
        return "TAR";
    case SWDR_AP_DRW:
        return "DRW";
    case SWDR_AP_BD0:
        return "BD0";
    case SWDR_AP_BD1:
        return "BD1";
    case SWDR_AP_BD2:
        return "BD2";
    case SWDR_AP_BD3:
        return "BD3";
    case SWDR_AP_CFG:
        return "CFG";
    case SWDR_AP_BASE:
        return "BASE";
    case SWDR_AP_RAZ_WI:
        return "RAZ_WI";
    case SWDR_AP_IDR:
        return "IDR";
    }

    return "??";
}